

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.hpp
# Opt level: O1

void __thiscall Amiga::MemoryMap::set_overlay(MemoryMap *this,bool enabled)

{
  uchar *puVar1;
  uint8_t *base;
  long lVar2;
  
  if (this->overlay_ != enabled) {
    this->overlay_ = enabled;
    base = (this->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    set_region(this,0,*(int *)&(this->chip_ram).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (int)base,base,0x18);
    if (enabled) {
      lVar2 = 0x80020;
      do {
        *(MemoryMap **)((this->kickstart)._M_elems + lVar2 + -8) = this;
        puVar1 = (this->kickstart)._M_elems + lVar2;
        puVar1[0] = '\b';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x80040);
    }
  }
  return;
}

Assistant:

void set_overlay(bool enabled) {
			if(overlay_ == enabled) {
				return;
			}
			overlay_ = enabled;

			set_region(0x00'0000, uint32_t(chip_ram.size()), chip_ram.data(), PermitReadWrite);
			if(enabled) {
				set_region(0x00'0000, 0x08'0000, kickstart.data(), PermitRead);
			}
		}